

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::cbtCollisionWorld
          (cbtCollisionWorld *this,cbtDispatcher *dispatcher,cbtBroadphaseInterface *pairCache,
          cbtCollisionConfiguration *collisionConfiguration)

{
  undefined1 auVar1 [16];
  
  this->_vptr_cbtCollisionWorld = (_func_int **)&PTR__cbtCollisionWorld_00b6fcb0;
  (this->m_collisionObjects).m_ownsMemory = true;
  (this->m_collisionObjects).m_data = (cbtCollisionObject **)0x0;
  (this->m_collisionObjects).m_size = 0;
  (this->m_collisionObjects).m_capacity = 0;
  this->m_dispatcher1 = dispatcher;
  (this->m_dispatchInfo).m_timeStep = 0.0;
  (this->m_dispatchInfo).m_stepCount = 0;
  (this->m_dispatchInfo).m_dispatchFunc = 1;
  (this->m_dispatchInfo).m_timeOfImpact = 1.0;
  (this->m_dispatchInfo).m_useContinuous = true;
  (this->m_dispatchInfo).m_debugDraw = (cbtIDebugDraw *)0x0;
  (this->m_dispatchInfo).m_enableSatConvex = false;
  (this->m_dispatchInfo).m_enableSPU = true;
  (this->m_dispatchInfo).m_useEpa = true;
  (this->m_dispatchInfo).m_allowedCcdPenetration = 0.04;
  (this->m_dispatchInfo).m_useConvexConservativeDistanceUtil = false;
  (this->m_dispatchInfo).m_convexConservativeDistanceThreshold = 0.0;
  (this->m_dispatchInfo).m_deterministicOverlappingPairs = false;
  this->m_broadphasePairCache = pairCache;
  this->m_debugDrawer = (cbtIDebugDraw *)0x0;
  this->m_forceUpdateAllAabbs = true;
  auVar1 = ZEXT816(0) << 0x20;
  (this->timer_collision_broad).m_start = (time_point)auVar1._0_8_;
  (this->timer_collision_broad).m_end = (time_point)auVar1._8_8_;
  (this->timer_collision_narrow).m_start = (time_point)auVar1._0_8_;
  (this->timer_collision_narrow).m_end = (time_point)auVar1._8_8_;
  return;
}

Assistant:

cbtCollisionWorld::cbtCollisionWorld(cbtDispatcher* dispatcher, cbtBroadphaseInterface* pairCache, cbtCollisionConfiguration* collisionConfiguration)
	: m_dispatcher1(dispatcher),
	  m_broadphasePairCache(pairCache),
	  m_debugDrawer(0),
	  m_forceUpdateAllAabbs(true)
{
}